

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O2

xml_node<char> * __thiscall
rapidxml::xml_node<char>::next_sibling
          (xml_node<char> *this,char *name,size_t name_size,bool case_sensitive)

{
  bool bVar1;
  size_t size1;
  char *p1;
  
  if ((this->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) {
    __assert_fail("this->m_parent",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/rapidxml/rapidxml.hpp"
                  ,0x3ee,
                  "xml_node<Ch> *rapidxml::xml_node<>::next_sibling(const Ch *, std::size_t, bool) const [Ch = char]"
                 );
  }
  if (name == (char *)0x0) {
    this = this->m_next_sibling;
  }
  else {
    if (name_size == 0) {
      name_size = internal::measure<char>(name);
    }
    do {
      this = this->m_next_sibling;
      if (this == (xml_node<char> *)0x0) {
        return (xml_node<char> *)0x0;
      }
      p1 = (this->super_xml_base<char>).m_name;
      if (p1 == (char *)0x0) {
        p1 = &xml_base<char>::nullstr()::zero;
        size1 = 0;
      }
      else {
        size1 = (this->super_xml_base<char>).m_name_size;
      }
      bVar1 = internal::compare<char>(p1,size1,name,name_size,case_sensitive);
    } while (!bVar1);
  }
  return this;
}

Assistant:

xml_node<Ch> *next_sibling(const Ch *name = 0, std::size_t name_size = 0, bool case_sensitive = true) const
        {
            assert(this->m_parent);     // Cannot query for siblings if node has no parent
            if (name)
            {
                if (name_size == 0)
                    name_size = internal::measure(name);
                for (xml_node<Ch> *sibling = m_next_sibling; sibling; sibling = sibling->m_next_sibling)
                    if (internal::compare(sibling->name(), sibling->name_size(), name, name_size, case_sensitive))
                        return sibling;
                return 0;
            }
            else
                return m_next_sibling;
        }